

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadOptions.cpp
# Opt level: O2

HighsLoadOptionsStatus
loadOptionsFromFile(HighsLogOptions *report_log_options,HighsOptions *options,string *filename)

{
  char cVar1;
  OptionStatus OVar2;
  long lVar3;
  uint local_31c;
  HighsLoadOptionsStatus local_318;
  string line;
  string non_chars;
  string value;
  string option;
  string local_278;
  string local_258 [32];
  ifstream file;
  
  if (filename->_M_string_length == 0) {
    local_318 = kEmpty;
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    option._M_dataplus._M_p = (pointer)&option.field_2;
    option._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    option.field_2._M_local_buf[0] = '\0';
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&non_chars,"\t\n\v\f\r\"\' ",(allocator *)&file);
    std::ifstream::ifstream(&file,(string *)filename,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      highsLogUser(report_log_options,kError,"Options file not found\n");
LAB_0022cfa9:
      local_318 = kError;
    }
    else {
      local_31c = 1;
      local_318 = kOk;
      while (*(int *)(&file.super_basic_istream<char,_std::char_traits<char>_>.field_0x20 +
                     (long)file.super_basic_istream<char,_std::char_traits<char>_>.
                           _vptr_basic_istream[-3]) == 0) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (&file.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
        if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
          lVar3 = std::__cxx11::string::find_first_of((char *)&line,0x39a22b);
          if ((lVar3 == -1) || (line._M_string_length <= lVar3 + 1U)) {
            highsLogUser(report_log_options,kError,"Error on line %d of options file.\n",
                         (ulong)local_31c);
            goto LAB_0022cfa9;
          }
          std::__cxx11::string::substr((ulong)local_258,(ulong)&line);
          std::__cxx11::string::operator=((string *)&option,local_258);
          std::__cxx11::string::~string(local_258);
          std::__cxx11::string::substr((ulong)local_258,(ulong)&line);
          std::__cxx11::string::operator=((string *)&value,local_258);
          std::__cxx11::string::~string(local_258);
          trim(&option,&non_chars);
          trim(&value,&non_chars);
          std::__cxx11::string::string((string *)&local_278,(string *)&value);
          OVar2 = setLocalOptionValue(report_log_options,&option,
                                      &(options->super_HighsOptionsStruct).log_options,
                                      &options->records,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          if (OVar2 != kOk) {
            highsLogUser(report_log_options,kError,"Cannot read value \"%s\" for option \"%s\"\n",
                         value._M_dataplus._M_p,option._M_dataplus._M_p);
            goto LAB_0022cfa9;
          }
        }
        local_31c = local_31c + 1;
      }
    }
    std::ifstream::~ifstream(&file);
    std::__cxx11::string::~string((string *)&non_chars);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&option);
    std::__cxx11::string::~string((string *)&line);
  }
  return local_318;
}

Assistant:

HighsLoadOptionsStatus loadOptionsFromFile(
    const HighsLogOptions& report_log_options, HighsOptions& options,
    const std::string filename) {
  if (filename.size() == 0) return HighsLoadOptionsStatus::kEmpty;

  string line, option, value;
  HighsInt line_count = 0;
  // loadOptionsFromFile needs its own non-chars string since the
  // default setting in io/stringutil.h excludes \" and \' that can
  // appear in an MPS name - the only other place where trim() is used
  const std::string non_chars = "\t\n\v\f\r\"\' ";
  std::ifstream file(filename);
  if (file.is_open()) {
    while (file.good()) {
      getline(file, line);
      line_count++;
      if (line.size() == 0 || line[0] == '#') continue;

      size_t equals = line.find_first_of("=");
      if (equals == std::string::npos || equals + 1 >= line.size()) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "Error on line %" HIGHSINT_FORMAT " of options file.\n",
                     line_count);
        return HighsLoadOptionsStatus::kError;
      }
      option = line.substr(0, equals);
      value = line.substr(equals + 1, line.size() - equals);
      trim(option, non_chars);
      trim(value, non_chars);
      if (setLocalOptionValue(report_log_options, option, options.log_options,
                              options.records, value) != OptionStatus::kOk) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "Cannot read value \"%s\" for option \"%s\"\n",
                     value.c_str(), option.c_str());
        return HighsLoadOptionsStatus::kError;
      }
    }
  } else {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "Options file not found\n");
    return HighsLoadOptionsStatus::kError;
  }

  return HighsLoadOptionsStatus::kOk;
}